

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O3

Aig_Man_t *
LivenessToSafetyTransformationOneStepLoop
          (int mode,Abc_Ntk_t *pNtk,Aig_Man_t *p,Vec_Ptr_t *vLive,Vec_Ptr_t *vFair,
          Vec_Ptr_t *vAssertSafety,Vec_Ptr_t *vAssumeSafety)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Aig_Man_t *p_00;
  char *pcVar6;
  Aig_Obj_t *pAVar7;
  size_t sVar8;
  char *pcVar9;
  ulong uVar10;
  Aig_Obj_t *pAVar11;
  Aig_Obj_t *pAVar12;
  int iVar13;
  Aig_Obj_t *pAVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  Aig_Obj_t *local_70;
  Aig_Obj_t *local_60;
  
  iVar15 = p->nRegs;
  if (iVar15 == 0) {
    puts("The input AIG contains no register, returning the original AIG as it is");
    return p;
  }
  uVar2 = p->nTruePis;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  iVar13 = 8;
  if (6 < uVar2) {
    iVar13 = uVar2 + 1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar13;
  if (iVar13 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar13 * 8);
  }
  pVVar4->pArray = ppvVar5;
  vecPis = pVVar4;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar13;
  if (iVar13 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar13 << 3);
  }
  pVVar4->pArray = ppvVar5;
  iVar17 = iVar15 * 2 + vLive->nSize;
  iVar15 = vFair->nSize;
  vecPiNames = pVVar4;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  iVar13 = 8;
  if (6 < (uint)(iVar17 + iVar15)) {
    iVar13 = iVar17 + iVar15 + 1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar13;
  if (iVar13 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar13 * 8);
  }
  pVVar4->pArray = ppvVar5;
  vecLos = pVVar4;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar13;
  if (iVar13 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar13 << 3);
  }
  pVVar4->pArray = ppvVar5;
  vecLoNames = pVVar4;
  p_00 = Aig_ManStart(p->vObjs->nSize * 2);
  pcVar6 = (char *)malloc(10);
  builtin_strncpy(pcVar6,"live2safe",10);
  p_00->pName = pcVar6;
  p_00->pSpec = (char *)0x0;
  pAVar11 = p->pConst1;
  pAVar11->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  if (0 < p->nTruePis) {
    lVar16 = 0;
    do {
      if (p->vCis->nSize <= lVar16) goto LAB_005ae271;
      pAVar11 = (Aig_Obj_t *)p->vCis->pArray[lVar16];
      pAVar7 = Aig_ObjCreateCi(p_00);
      (pAVar11->field_5).pData = pAVar7;
      pVVar4 = vecPis;
      uVar2 = vecPis->nSize;
      if (uVar2 == vecPis->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vecPis->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vecPis->pArray,0x80);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = 0x10;
        }
        else {
          if (vecPis->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(vecPis->pArray,(ulong)uVar2 << 4);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = uVar2 * 2;
        }
      }
      else {
        ppvVar5 = vecPis->pArray;
      }
      iVar15 = pVVar4->nSize;
      pVVar4->nSize = iVar15 + 1;
      ppvVar5[iVar15] = pAVar7;
      if (pNtk->vPis->nSize <= lVar16) goto LAB_005ae271;
      pcVar6 = Abc_ObjName((Abc_Obj_t *)pNtk->vPis->pArray[lVar16]);
      if (pcVar6 == (char *)0x0) {
        pcVar9 = (char *)0x0;
      }
      else {
        sVar8 = strlen(pcVar6);
        pcVar9 = (char *)malloc(sVar8 + 1);
        strcpy(pcVar9,pcVar6);
      }
      pVVar4 = vecPiNames;
      uVar2 = vecPiNames->nSize;
      if (uVar2 == vecPiNames->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vecPiNames->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vecPiNames->pArray,0x80);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = 0x10;
        }
        else {
          if (vecPiNames->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(vecPiNames->pArray,(ulong)uVar2 << 4);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = uVar2 * 2;
        }
      }
      else {
        ppvVar5 = vecPiNames->pArray;
      }
      iVar15 = pVVar4->nSize;
      pVVar4->nSize = iVar15 + 1;
      ppvVar5[iVar15] = pcVar9;
      lVar16 = lVar16 + 1;
    } while (lVar16 < p->nTruePis);
  }
  uVar2 = mode - 3;
  if (uVar2 < 2) {
    local_60 = Aig_ObjCreateCi(p_00);
    pVVar4 = vecPiNames;
    uVar3 = vecPiNames->nSize;
    if (uVar3 == vecPiNames->nCap) {
      if ((int)uVar3 < 0x10) {
        if (vecPiNames->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(0x80);
        }
        else {
          ppvVar5 = (void **)realloc(vecPiNames->pArray,0x80);
        }
        pVVar4->pArray = ppvVar5;
        pVVar4->nCap = 0x10;
      }
      else {
        if (vecPiNames->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc((ulong)uVar3 << 4);
        }
        else {
          ppvVar5 = (void **)realloc(vecPiNames->pArray,(ulong)uVar3 << 4);
        }
        pVVar4->pArray = ppvVar5;
        pVVar4->nCap = uVar3 * 2;
      }
    }
    else {
      ppvVar5 = vecPiNames->pArray;
    }
    iVar15 = pVVar4->nSize;
    pVVar4->nSize = iVar15 + 1;
    ppvVar5[iVar15] = "SAVE_BIERE";
  }
  else {
    local_60 = (Aig_Obj_t *)0x0;
  }
  if (0 < p->nRegs) {
    iVar15 = 0;
    do {
      uVar3 = p->nTruePis + iVar15;
      if (((int)uVar3 < 0) || (p->vCis->nSize <= (int)uVar3)) goto LAB_005ae271;
      pAVar11 = (Aig_Obj_t *)p->vCis->pArray[uVar3];
      pAVar7 = Aig_ObjCreateCi(p_00);
      (pAVar11->field_5).pData = pAVar7;
      pVVar4 = vecLos;
      uVar3 = vecLos->nSize;
      if (uVar3 == vecLos->nCap) {
        if ((int)uVar3 < 0x10) {
          if (vecLos->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vecLos->pArray,0x80);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = 0x10;
        }
        else {
          if (vecLos->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar3 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(vecLos->pArray,(ulong)uVar3 << 4);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = uVar3 * 2;
        }
      }
      else {
        ppvVar5 = vecLos->pArray;
      }
      iVar13 = pVVar4->nSize;
      pVVar4->nSize = iVar13 + 1;
      ppvVar5[iVar13] = pAVar7;
      uVar3 = pNtk->vPis->nSize + iVar15;
      if (((int)uVar3 < 0) || (pNtk->vCis->nSize <= (int)uVar3)) goto LAB_005ae271;
      pcVar6 = Abc_ObjName((Abc_Obj_t *)pNtk->vCis->pArray[uVar3]);
      if (pcVar6 == (char *)0x0) {
        pcVar9 = (char *)0x0;
      }
      else {
        sVar8 = strlen(pcVar6);
        pcVar9 = (char *)malloc(sVar8 + 1);
        strcpy(pcVar9,pcVar6);
      }
      pVVar4 = vecLoNames;
      uVar3 = vecLoNames->nSize;
      if (uVar3 == vecLoNames->nCap) {
        if ((int)uVar3 < 0x10) {
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vecLoNames->pArray,0x80);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = 0x10;
        }
        else {
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar3 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(vecLoNames->pArray,(ulong)uVar3 << 4);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = uVar3 * 2;
        }
      }
      else {
        ppvVar5 = vecLoNames->pArray;
      }
      iVar13 = pVVar4->nSize;
      pVVar4->nSize = iVar13 + 1;
      ppvVar5[iVar13] = pcVar9;
      iVar15 = iVar15 + 1;
    } while (iVar15 < p->nRegs);
  }
  pVVar4 = p->vObjs;
  if (0 < pVVar4->nSize) {
    lVar16 = 0;
    do {
      pAVar11 = (Aig_Obj_t *)pVVar4->pArray[lVar16];
      if ((pAVar11 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar11->field_0x18 & 7) - 7)) {
        if (((ulong)pAVar11 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar10 = (ulong)pAVar11->pFanin0 & 0xfffffffffffffffe;
        if (uVar10 == 0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Aig_Obj_t *)((ulong)((uint)pAVar11->pFanin0 & 1) ^ *(ulong *)(uVar10 + 0x28));
        }
        uVar10 = (ulong)pAVar11->pFanin1 & 0xfffffffffffffffe;
        if (uVar10 == 0) {
          pAVar12 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar12 = (Aig_Obj_t *)((ulong)((uint)pAVar11->pFanin1 & 1) ^ *(ulong *)(uVar10 + 0x28));
        }
        pAVar7 = Aig_And(p_00,pAVar7,pAVar12);
        (pAVar11->field_5).pData = pAVar7;
        pVVar4 = p->vObjs;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar4->nSize);
  }
  if ((mode == 4) || (mode == 1)) {
    iVar15 = vAssertSafety->nSize;
    if (iVar15 == 0) {
      puts("No safety property is specified, hence no safety gate is created");
    }
    else {
      iVar13 = vAssumeSafety->nSize;
      if (iVar13 == 0) {
        if (iVar15 < 1) {
          pAVar7 = (Aig_Obj_t *)0x1;
        }
        else {
          lVar16 = 0;
          pAVar12 = (Aig_Obj_t *)0x0;
          do {
            pAVar11 = (Aig_Obj_t *)vAssertSafety->pArray[lVar16];
            pAVar7 = (Aig_Obj_t *)
                     ((ulong)((uint)pAVar11->pFanin0 & 1) ^
                     *(ulong *)(((ulong)pAVar11->pFanin0 & 0xfffffffffffffffe) + 0x28));
            if (pAVar12 != (Aig_Obj_t *)0x0) {
              pAVar7 = Aig_And(p_00,pAVar7,pAVar12);
              iVar15 = vAssertSafety->nSize;
            }
            lVar16 = lVar16 + 1;
            pAVar12 = pAVar7;
          } while (lVar16 < iVar15);
          pAVar7 = (Aig_Obj_t *)((ulong)pAVar7 ^ 1);
        }
        Aig_ObjCreateCo(p_00,pAVar7);
      }
      else {
        if (iVar15 < 1) {
          pAVar7 = (Aig_Obj_t *)0x1;
        }
        else {
          lVar16 = 0;
          pAVar12 = (Aig_Obj_t *)0x0;
          do {
            pAVar11 = (Aig_Obj_t *)vAssertSafety->pArray[lVar16];
            pAVar7 = (Aig_Obj_t *)
                     ((ulong)((uint)pAVar11->pFanin0 & 1) ^
                     *(ulong *)(((ulong)pAVar11->pFanin0 & 0xfffffffffffffffe) + 0x28));
            if (pAVar12 != (Aig_Obj_t *)0x0) {
              pAVar7 = Aig_And(p_00,pAVar7,pAVar12);
              iVar15 = vAssertSafety->nSize;
            }
            lVar16 = lVar16 + 1;
            pAVar12 = pAVar7;
          } while (lVar16 < iVar15);
          iVar13 = vAssumeSafety->nSize;
          pAVar7 = (Aig_Obj_t *)((ulong)pAVar7 ^ 1);
        }
        if (iVar13 < 1) {
          pAVar12 = (Aig_Obj_t *)0x0;
        }
        else {
          lVar16 = 0;
          pAVar14 = (Aig_Obj_t *)0x0;
          do {
            pAVar11 = (Aig_Obj_t *)vAssumeSafety->pArray[lVar16];
            pAVar12 = (Aig_Obj_t *)
                      ((ulong)((uint)pAVar11->pFanin0 & 1) ^
                      *(ulong *)(((ulong)pAVar11->pFanin0 & 0xfffffffffffffffe) + 0x28));
            if (pAVar14 != (Aig_Obj_t *)0x0) {
              pAVar12 = Aig_And(p_00,pAVar12,pAVar14);
              iVar13 = vAssumeSafety->nSize;
            }
            lVar16 = lVar16 + 1;
            pAVar14 = pAVar12;
          } while (lVar16 < iVar13);
        }
        pAVar7 = Aig_And(p_00,pAVar7,pAVar12);
        Aig_ObjCreateCo(p_00,pAVar7);
      }
    }
  }
  if (uVar2 < 2) {
    local_70 = Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)
                                     (((ulong)pAVar11->pFanin0 & 0xfffffffffffffffe) + 0x28));
    if (0 < p->nRegs) goto LAB_005adf8f;
    iVar15 = 0;
LAB_005ae0e5:
    pAVar7 = (Aig_Obj_t *)0x0;
  }
  else {
    iVar15 = 0;
    if (p->nRegs < 1) goto LAB_005ae205;
    local_70 = (Aig_Obj_t *)0x0;
LAB_005adf8f:
    iVar15 = 0;
    do {
      iVar13 = p->nTruePis;
      uVar3 = iVar15 + iVar13;
      if (((int)uVar3 < 0) || (p->vCis->nSize <= (int)uVar3)) goto LAB_005ae271;
      piVar1 = (int *)p->vCis->pArray[uVar3];
      if (((piVar1[6] & 7U) != 2) || (iVar17 = *piVar1, iVar17 < iVar13)) goto LAB_005ae290;
      uVar3 = (iVar17 - iVar13) + p->nTruePos;
      if (((int)uVar3 < 0) || (p->vCos->nSize <= (int)uVar3)) goto LAB_005ae271;
      uVar10 = *(ulong *)((long)p->vCos->pArray[uVar3] + 8);
      Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                           ((ulong)((uint)uVar10 & 1) ^
                           *(ulong *)((uVar10 & 0xfffffffffffffffe) + 0x28)));
      iVar15 = iVar15 + 1;
    } while (iVar15 < p->nRegs);
    if (1 < uVar2) goto LAB_005ae205;
    iVar13 = 0;
    if (p->nRegs < 1) goto LAB_005ae0e5;
    pAVar11 = (Aig_Obj_t *)0x0;
    do {
      iVar17 = p->nTruePis;
      uVar2 = iVar13 + iVar17;
      if (((int)uVar2 < 0) || (p->vCis->nSize <= (int)uVar2)) {
LAB_005ae271:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      piVar1 = (int *)p->vCis->pArray[uVar2];
      if (((piVar1[6] & 7U) != 2) || (*piVar1 < iVar17)) {
LAB_005ae290:
        __assert_fail("Saig_ObjIsLo(p, pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saig.h"
                      ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar2 = (*piVar1 - iVar17) + p->nTruePos;
      if (((int)uVar2 < 0) || (p->vCos->nSize <= (int)uVar2)) goto LAB_005ae271;
      uVar10 = *(ulong *)((long)p->vCos->pArray[uVar2] + 8);
      pAVar7 = Aig_Exor(p_00,*(Aig_Obj_t **)(piVar1 + 10),
                        (Aig_Obj_t *)
                        ((ulong)((uint)uVar10 & 1) ^
                        *(ulong *)((uVar10 & 0xfffffffffffffffe) + 0x28)));
      pAVar7 = (Aig_Obj_t *)((ulong)pAVar7 ^ 1);
      if (pAVar11 != (Aig_Obj_t *)0x0) {
        pAVar7 = Aig_And(p_00,pAVar7,pAVar11);
      }
      iVar13 = iVar13 + 1;
      pAVar11 = pAVar7;
    } while (iVar13 < p->nRegs);
  }
  pAVar11 = Aig_And(p_00,local_60,pAVar7);
  if ((vLive == (Vec_Ptr_t *)0x0) || (iVar13 = vLive->nSize, iVar13 == 0)) {
    puts("Circuit without any liveness property");
LAB_005ae169:
    pAVar12 = p_00->pConst1;
  }
  else {
    if (iVar13 < 1) goto LAB_005ae169;
    lVar16 = 0;
    pAVar7 = (Aig_Obj_t *)0x0;
    do {
      uVar10 = *(ulong *)((long)vLive->pArray[lVar16] + 8);
      pAVar12 = (Aig_Obj_t *)
                ((ulong)((uint)uVar10 & 1) ^ *(ulong *)((uVar10 & 0xfffffffffffffffe) + 0x28));
      if (pAVar7 != (Aig_Obj_t *)0x0) {
        pAVar12 = Aig_And(p_00,pAVar12,pAVar7);
        iVar13 = vLive->nSize;
      }
      lVar16 = lVar16 + 1;
      pAVar7 = pAVar12;
    } while (lVar16 < iVar13);
    if (pAVar12 == (Aig_Obj_t *)0x0) goto LAB_005ae169;
  }
  if ((vFair == (Vec_Ptr_t *)0x0) || (iVar13 = vFair->nSize, iVar13 == 0)) {
    puts("Circuit without any fairness property");
LAB_005ae1d1:
    pAVar14 = p_00->pConst1;
  }
  else {
    if (iVar13 < 1) goto LAB_005ae1d1;
    lVar16 = 0;
    pAVar7 = (Aig_Obj_t *)0x0;
    do {
      uVar10 = *(ulong *)((long)vFair->pArray[lVar16] + 8);
      pAVar14 = (Aig_Obj_t *)
                ((ulong)((uint)uVar10 & 1) ^ *(ulong *)((uVar10 & 0xfffffffffffffffe) + 0x28));
      if (pAVar7 != (Aig_Obj_t *)0x0) {
        pAVar14 = Aig_And(p_00,pAVar14,pAVar7);
        iVar13 = vFair->nSize;
      }
      lVar16 = lVar16 + 1;
      pAVar7 = pAVar14;
    } while (lVar16 < iVar13);
    if (pAVar14 == (Aig_Obj_t *)0x0) goto LAB_005ae1d1;
  }
  pAVar7 = Aig_And(p_00,pAVar14,(Aig_Obj_t *)((ulong)pAVar12 ^ 1));
  pAVar11 = Aig_And(p_00,pAVar11,pAVar7);
  Aig_ObjPatchFanin0(p_00,local_70,pAVar11);
LAB_005ae205:
  Aig_ManSetRegNum(p_00,iVar15);
  iVar15 = p_00->vCis->nSize;
  p_00->nObjs[2] = iVar15;
  iVar13 = p_00->nRegs;
  if (iVar13 == 0) {
    iVar15 = p_00->vCos->nSize;
  }
  else {
    p_00->nTruePis = iVar15 - iVar13;
    iVar15 = p_00->vCos->nSize;
    p_00->nTruePos = iVar15 - iVar13;
  }
  p_00->nObjs[3] = iVar15;
  Aig_ManCleanup(p_00);
  iVar15 = Aig_ManCheck(p_00);
  if (iVar15 != 0) {
    return p_00;
  }
  __assert_fail("Aig_ManCheck( pNew )",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/liveness.c"
                ,0x470,
                "Aig_Man_t *LivenessToSafetyTransformationOneStepLoop(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
               );
}

Assistant:

Aig_Man_t * LivenessToSafetyTransformationOneStepLoop( int mode, Abc_Ntk_t * pNtk, Aig_Man_t * p, 
													  Vec_Ptr_t *vLive, Vec_Ptr_t *vFair, Vec_Ptr_t *vAssertSafety, Vec_Ptr_t *vAssumeSafety )
{
	Aig_Man_t * pNew;
	int i, nRegCount;
	Aig_Obj_t * pObjSavePi = NULL;
	Aig_Obj_t *pObj, *pMatch;
	Aig_Obj_t *pObjSavedLoAndEquality;
	Aig_Obj_t *pObjXor, *pObjXnor, *pObjAndAcc, *pObjAndAccDummy;
	Aig_Obj_t *pObjLive, *pObjFair, *pObjSafetyGate;
	Aig_Obj_t *pObjSafetyPropertyOutput = NULL;
	Aig_Obj_t *pDriverImage;
	Aig_Obj_t *pObjCorrespondingLi;
	Aig_Obj_t *pArgument;
	Aig_Obj_t *collectiveAssertSafety, *collectiveAssumeSafety;

	char *nodeName;
	int piCopied = 0, liCopied = 0, loCopied = 0;//, liCreated = 0, loCreated = 0, piVecIndex = 0;

	if( Aig_ManRegNum( p ) == 0 )
	{
		printf("The input AIG contains no register, returning the original AIG as it is\n");
		return p;
	}

	vecPis = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);
	vecPiNames = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);

	vecLos = Vec_PtrAlloc( Saig_ManRegNum( p )*2 + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );
	vecLoNames = Vec_PtrAlloc( Saig_ManRegNum( p )*2 + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );

	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNew = Aig_ManStart( 2 * Aig_ManObjNumMax(p) );
	pNew->pName = Abc_UtilStrsav( "live2safe" );
    pNew->pSpec = NULL;
    
	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    pObj = Aig_ManConst1( p );
    pObj->pData = Aig_ManConst1( pNew );

	//****************************************************************
    // Step 3: create true PIs
	//****************************************************************
    Saig_ManForEachPi( p, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNew);
		Vec_PtrPush( vecPis, pObj->pData );
		nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkPi( pNtk, i ) ));
		Vec_PtrPush( vecPiNames, nodeName );
	}

	//****************************************************************
	// Step 4: create the special Pi corresponding to SAVE
	//****************************************************************
	if( mode == FULL_BIERE_ONE_LOOP_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE )
	{
		pObjSavePi = Aig_ObjCreateCi( pNew );
		nodeName = "SAVE_BIERE",
		Vec_PtrPush( vecPiNames, nodeName );
	}
			
	//****************************************************************
	// Step 5: create register outputs
	//****************************************************************
    Saig_ManForEachLo( p, pObj, i )
    {
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNew);
		Vec_PtrPush( vecLos, pObj->pData );
		nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ));
		Vec_PtrPush( vecLoNames, nodeName );
    }

	//****************************************************************
	// Step 6: create "saved" register output
	//****************************************************************

#if 0
	loCreated++;
	pObjSavedLo = Aig_ObjCreateCi( pNew );
	Vec_PtrPush( vecLos, pObjSavedLo );
	nodeName = "SAVED_LO";
	Vec_PtrPush( vecLoNames, nodeName );
#endif

	//****************************************************************
	// Step 7: create the OR gate and the AND gate directly fed by "SAVE" Pi
	//****************************************************************
#if 0
	pObjSaveOrSaved = Aig_Or( pNew, pObjSavePi, pObjSavedLo );
	pObjSaveAndNotSaved = Aig_And( pNew, pObjSavePi, Aig_Not(pObjSavedLo) );
#endif

	//********************************************************************
	// Step 8: create internal nodes
	//********************************************************************
    Aig_ManForEachNode( p, pObj, i )
	{
		pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}

#if 0
	//********************************************************************
	// Step 8.x : create PO for each safety assertions
	//********************************************************************
	Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCo( pNew, Aig_NotCond(Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) ) );
	}
#endif

	if( mode == FULL_BIERE_ONE_LOOP_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE )
	{
		if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) == 0 )
		{
			pObjAndAcc = NULL;
			Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
			{
				//pObj->pData = Aig_ObjCreateCo( pNew, Aig_NotCond(Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) ) );
				pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
				if( pObjAndAcc == NULL )
					pObjAndAcc = pArgument;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAccDummy );
				}
			}
			Aig_ObjCreateCo( pNew, Aig_Not(pObjAndAcc) );
		}
		else if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) != 0 )
		{
			pObjAndAcc = NULL;
			Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
			{
				//pObj->pData = Aig_ObjCreateCo( pNew, Aig_NotCond(Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) ) );
				pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
				if( pObjAndAcc == NULL )
					pObjAndAcc = pArgument;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAccDummy );
				}
			}
			collectiveAssertSafety = pObjAndAcc;
			pObjAndAcc = NULL;
			Vec_PtrForEachEntry( Aig_Obj_t *, vAssumeSafety, pObj, i )
			{
				//pObj->pData = Aig_ObjCreateCo( pNew, Aig_NotCond(Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) ) );
				pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
				if( pObjAndAcc == NULL )
					pObjAndAcc = pArgument;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAccDummy );
				}
			}
			collectiveAssumeSafety = pObjAndAcc;
			Aig_ObjCreateCo( pNew, Aig_And( pNew, Aig_Not(collectiveAssertSafety), collectiveAssumeSafety ) );
		}
		else
			printf("No safety property is specified, hence no safety gate is created\n");
	}

	//********************************************************************
	// Step 9: create the safety property output gate
	// create the safety property output gate, this will be the sole true PO 
	// of the whole circuit, discuss with Sat/Alan for an alternative implementation
	//********************************************************************

	if( mode == FULL_BIERE_ONE_LOOP_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE )
	{
		pObjSafetyPropertyOutput = Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
	}

	// create register inputs for the original registers
    nRegCount = 0;
	
	Saig_ManForEachLo( p, pObj, i )
    {
		pMatch = Saig_ObjLoToLi( p, pObj );
        //Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pMatch) );
		Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pMatch)->pData, Aig_ObjFaninC0( pMatch ) ) );
        nRegCount++;
		liCopied++;
    }

#if 0
	// create register input corresponding to the register "saved"
	pObjSavedLi = Aig_ObjCreateCo( pNew, pObjSaveOrSaved );
	nRegCount++;
	liCreated++;7
#endif

	pObjAndAcc = NULL;

	//****************************************************************************************************
	//For detection of loop of length 1 we do not need any shadow register, we only need equality detector
	//between Lo_j and Li_j and then a cascade of AND gates
	//****************************************************************************************************

	if( mode == FULL_BIERE_ONE_LOOP_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE )
	{
		Saig_ManForEachLo( p, pObj, i )
		{
			pObjCorrespondingLi = Saig_ObjLoToLi( p, pObj );
		
			pObjXor = Aig_Exor( pNew, (Aig_Obj_t *)pObj->pData,  Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0( pObjCorrespondingLi )->pData, Aig_ObjFaninC0( pObjCorrespondingLi ) ) );
			pObjXnor = Aig_Not( pObjXor );
		
			if( pObjAndAcc == NULL )
				pObjAndAcc = pObjXnor;
			else
			{
				pObjAndAccDummy = pObjAndAcc;
				pObjAndAcc = Aig_And( pNew, pObjXnor, pObjAndAccDummy );
			}
		}

		// create the AND gate whose output will be the signal "looped"
		pObjSavedLoAndEquality = Aig_And( pNew, pObjSavePi, pObjAndAcc );
	
		// create the master AND gate and corresponding AND and OR logic for the liveness properties
		pObjAndAcc = NULL;
		if( vLive == NULL || Vec_PtrSize( vLive ) == 0 )
			printf("Circuit without any liveness property\n");
		else
		{
			Vec_PtrForEachEntry( Aig_Obj_t *, vLive, pObj, i )
			{
				pDriverImage = Aig_NotCond((Aig_Obj_t *)Aig_Regular(Aig_ObjChild0( pObj ))->pData, Aig_ObjFaninC0(pObj));
				if( pObjAndAcc == NULL )
					pObjAndAcc = pDriverImage;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pDriverImage, pObjAndAccDummy );
				}
			}
		}

		if( pObjAndAcc != NULL )
			pObjLive = pObjAndAcc;
		else
			pObjLive = Aig_ManConst1( pNew );
	
		// create the master AND gate and corresponding AND and OR logic for the fairness properties
		pObjAndAcc = NULL;
		if( vFair == NULL || Vec_PtrSize( vFair ) == 0 )
			printf("Circuit without any fairness property\n");
		else
		{
			Vec_PtrForEachEntry( Aig_Obj_t *, vFair, pObj, i )
			{
				pDriverImage = Aig_NotCond((Aig_Obj_t *)Aig_Regular(Aig_ObjChild0( pObj ))->pData, Aig_ObjFaninC0(pObj));
				if( pObjAndAcc == NULL )
					pObjAndAcc = pDriverImage;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pDriverImage, pObjAndAccDummy );
				}
			}
		}

		if( pObjAndAcc != NULL )
			pObjFair = pObjAndAcc;
		else
			pObjFair = Aig_ManConst1( pNew );
	
		pObjSafetyGate = Aig_And( pNew, pObjSavedLoAndEquality, Aig_And( pNew, pObjFair, Aig_Not( pObjLive ) ) );
	
		Aig_ObjPatchFanin0( pNew, pObjSafetyPropertyOutput, pObjSafetyGate );
	}

	Aig_ManSetRegNum( pNew, nRegCount );

	//printf("\nSaig_ManPiNum = %d, Reg Num = %d, before everything, before Pi cleanup\n", Vec_PtrSize( pNew->vPis ), pNew->nRegs );

	Aig_ManCiCleanupBiere( pNew );
	Aig_ManCoCleanupBiere( pNew );

	Aig_ManCleanup( pNew );
	
	assert( Aig_ManCheck( pNew ) );
	
	return pNew;
}